

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::SetFullJitThreshold
          (FunctionExecutionStateMachine *this,uint16 newFullJitThreshold,bool skipSimpleJit)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  bool bVar5;
  bool bVar6;
  uint sourceContextId;
  undefined4 *puVar7;
  Type *limit;
  long lVar8;
  char *pcVar9;
  FunctionExecutionStateMachine *this_00;
  Type local_48;
  anon_class_16_2_023ad54b ScaleLimit;
  int scale;
  
  pcVar9 = (char *)this;
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x158,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) goto LAB_0078ac6e;
    *puVar7 = 0;
  }
  EVar4 = StateToMode((FunctionExecutionStateMachine *)pcVar9,this->executionState);
  VerifyExecutionMode(this,EVar4);
  if (EVar4 == FullJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x159,"(GetExecutionMode() != ExecutionMode::FullJit)",
                                "GetExecutionMode() != ExecutionMode::FullJit");
    if (!bVar3) goto LAB_0078ac6e;
    *puVar7 = 0;
  }
  ScaleLimit.this._4_4_ = (uint)newFullJitThreshold - (uint)this->fullJitThreshold;
  if (this->fullJitThreshold == newFullJitThreshold) {
    VerifyExecutionModeLimits(this);
    return;
  }
  this->fullJitThreshold = newFullJitThreshold;
  local_48.ptr = (FunctionBody *)((long)&ScaleLimit.this + 4);
  ScaleLimit.scale = (int *)this;
  bVar3 = FunctionBody::DoSimpleJit((this->owner).ptr);
  bVar5 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  if ((bVar3) && (DAT_015bbe4c != 0)) {
    pcVar9 = (char *)&local_48;
    bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                      ((anon_class_16_2_023ad54b *)pcVar9,&this->simpleJitLimit);
    if (!bVar6) goto LAB_0078a982;
  }
  else {
LAB_0078a982:
    if (bVar5) {
      bVar6 = FunctionBody::DoInterpreterAutoProfile((this->owner).ptr);
      if (bVar6) {
        pcVar9 = (char *)&local_48;
        bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->autoProfilingInterpreter1Limit)
        ;
        if (bVar6) goto LAB_0078aa98;
        limit = &this->autoProfilingInterpreter0Limit;
        goto LAB_0078a9b2;
      }
    }
    else {
      limit = &this->interpreterLimit;
LAB_0078a9b2:
      pcVar9 = (char *)&local_48;
      bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)pcVar9,limit);
      if (bVar6) goto LAB_0078aa98;
    }
    if (DAT_015bbe4c == 1) {
      if (bVar5) {
        pcVar9 = (char *)&local_48;
        bVar3 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->profilingInterpreter1Limit);
        lVar8 = 0xe;
        if (!bVar3) goto LAB_0078aa33;
        goto LAB_0078aa98;
      }
    }
    else {
      if (bVar5) {
        pcVar9 = (char *)&local_48;
        bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->profilingInterpreter0Limit);
        if (bVar6) goto LAB_0078aa98;
      }
      if (bVar3) {
        pcVar9 = (char *)&local_48;
        bVar3 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->simpleJitLimit);
        lVar8 = 0x14;
        if (bVar5 && !bVar3) goto LAB_0078aa33;
      }
      else {
        lVar8 = 0x14;
        if (!bVar5) goto LAB_0078aa43;
LAB_0078aa33:
        pcVar9 = (char *)&local_48;
        bVar3 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,
                           (uint16 *)((long)&(this->owner).ptr + lVar8));
      }
      if (bVar3 != false) goto LAB_0078aa98;
    }
LAB_0078aa43:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x199,"(fullyScaled)","fullyScaled");
    if (!bVar3) goto LAB_0078ac6e;
    *puVar7 = 0;
  }
LAB_0078aa98:
  if (ScaleLimit.this._4_4_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x19a,"(scale == 0)","scale == 0");
    if (!bVar3) goto LAB_0078ac6e;
    *puVar7 = 0;
  }
  EVar4 = StateToMode((FunctionExecutionStateMachine *)pcVar9,this->executionState);
  this_00 = this;
  VerifyExecutionMode(this,EVar4);
  if (EVar4 != SimpleJit) {
    EVar4 = StateToMode(this_00,this->executionState);
    VerifyExecutionMode(this,EVar4);
    if (ProfilingInterpreter < EVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                  ,0x19e,"(IsInterpreterExecutionMode())",
                                  "IsInterpreterExecutionMode()");
      if (!bVar3) goto LAB_0078ac6e;
      *puVar7 = 0;
    }
    if ((skipSimpleJit || this->simpleJitLimit < 0x10) && this->simpleJitLimit != 0) {
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
      pFVar1 = (this->owner).ptr;
      if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_0078ac6e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015b0240,SimpleJitPhase,sourceContextId,
                                ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
      if (!bVar3) {
        (&this->autoProfilingInterpreter1Limit)[(ulong)(DAT_015bbe4c ^ 1) * 2] =
             (&this->autoProfilingInterpreter1Limit)[(ulong)(DAT_015bbe4c ^ 1) * 2] +
             this->simpleJitLimit;
        this->simpleJitLimit = 0;
        TryTransitionToNextInterpreterExecutionMode(this);
      }
    }
  }
  VerifyExecutionModeLimits(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetFullJitThreshold(const uint16 newFullJitThreshold, const bool skipSimpleJit)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() != ExecutionMode::FullJit);

        int scale = newFullJitThreshold - fullJitThreshold;
        if (scale == 0)
        {
            VerifyExecutionModeLimits();
            return;
        }
        fullJitThreshold = newFullJitThreshold;

        const auto ScaleLimit = [&](uint16 &limit) -> bool
        {
            Assert(scale != 0);
            const int limitScale = max(-static_cast<int>(limit), scale);
            const int newLimit = limit + limitScale;
            Assert(static_cast<int>(static_cast<uint16>(newLimit)) == newLimit);
            limit = static_cast<uint16>(newLimit);
            scale -= limitScale;
            Assert(limit == 0 || scale == 0);

            if (&limit == &simpleJitLimit)
            {
                FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
                if (owner->GetDefaultFunctionEntryPointInfo() == simpleJitEntryPointInfo)
                {
                    Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
                    const int newSimpleJitCallCount = max(0, (int)simpleJitEntryPointInfo->callsCount + limitScale);
                    Assert(static_cast<int>(static_cast<uint16>(newSimpleJitCallCount)) == newSimpleJitCallCount);
                    SetSimpleJitCallCount(static_cast<uint16>(newSimpleJitCallCount));
                }
            }

            return scale == 0;
        };

        /*
        Determine which execution mode's limit scales with the full JIT threshold, in order of preference:
        - New simple JIT
        - Auto-profiling interpreter 1
        - Auto-profiling interpreter 0
        - Interpreter
        - Profiling interpreter 0 (when using old simple JIT)
        - Old simple JIT
        - Profiling interpreter 1
        - Profiling interpreter 0 (when using new simple JIT)
        */
        const bool doSimpleJit = owner->DoSimpleJit();
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        const bool fullyScaled =
            (CONFIG_FLAG(NewSimpleJit) && doSimpleJit && ScaleLimit(simpleJitLimit)) ||
            (
                doInterpreterProfile
                ? owner->DoInterpreterAutoProfile() &&
                (ScaleLimit(autoProfilingInterpreter1Limit) || ScaleLimit(autoProfilingInterpreter0Limit))
                : ScaleLimit(interpreterLimit)
                ) ||
                (
                    CONFIG_FLAG(NewSimpleJit)
                    ? doInterpreterProfile &&
                    (ScaleLimit(profilingInterpreter1Limit) || ScaleLimit(profilingInterpreter0Limit))
                    : (doInterpreterProfile && ScaleLimit(profilingInterpreter0Limit)) ||
                    (doSimpleJit && ScaleLimit(simpleJitLimit)) ||
                    (doInterpreterProfile && ScaleLimit(profilingInterpreter1Limit))
                    );
        Assert(fullyScaled);
        Assert(scale == 0);

        if (GetExecutionMode() != ExecutionMode::SimpleJit)
        {
            Assert(IsInterpreterExecutionMode());
            if (simpleJitLimit != 0 &&
                (skipSimpleJit || simpleJitLimit < DEFAULT_CONFIG_MinSimpleJitIterations) &&
                !PHASE_FORCE(Phase::SimpleJitPhase, owner))
            {
                // Simple JIT code has not yet been generated, and was either requested to be skipped, or the limit was scaled
                // down too much. Skip simple JIT by moving any remaining iterations to an equivalent interpreter execution
                // mode.
                (CONFIG_FLAG(NewSimpleJit) ? autoProfilingInterpreter1Limit : profilingInterpreter1Limit) += simpleJitLimit;
                simpleJitLimit = 0;
                TryTransitionToNextInterpreterExecutionMode();
            }
        }

        VerifyExecutionModeLimits();
    }